

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Machine * unify(Machine *__return_storage_ptr__,Machine *m,Addr a1,Addr a2)

{
  bool bVar1;
  Hix HVar2;
  Hix HVar3;
  mapped_type *pmVar4;
  int iVar5;
  Addr a1_00;
  Addr a2_00;
  Addr a;
  Machine local_418;
  Machine local_3a8;
  Machine local_338;
  Machine local_2c8;
  Machine local_258;
  Machine local_1e8;
  Machine local_178;
  undefined1 local_108 [8];
  Functor f2;
  Hcell h1;
  Hcell h2;
  Functor f1;
  Addr local_50;
  Hix local_44;
  Addr local_40;
  
  local_44 = a2.hix_.hix;
  Machine::Machine(&local_3a8,m);
  local_40 = deref(&local_3a8,a1);
  Machine::~Machine(&local_3a8);
  Machine::Machine(&local_338,m);
  a.hix_.hix = local_44.hix;
  a.tag_ = (int)a2._0_8_;
  a.r_.r = (int)((ulong)a2._0_8_ >> 0x20);
  local_50 = deref(&local_338,a);
  Machine::~Machine(&local_338);
  bVar1 = Addr::operator==(&local_40,&local_50);
  if (bVar1) {
    Machine::Machine(__return_storage_ptr__,m);
  }
  else {
    Machine::Machine(&local_2c8,m);
    machineAtAddr((Hcell *)&f2.arity,&local_2c8,local_40);
    Machine::~Machine(&local_2c8);
    Machine::Machine(&local_1e8,m);
    machineAtAddr((Hcell *)&h1.f_.arity,&local_1e8,local_50);
    Machine::~Machine(&local_1e8);
    if ((f2.arity == 0) || (h1.f_.arity == 0)) {
      Machine::Machine(&local_178,m);
      bind((int)__return_storage_ptr__,(sockaddr *)&local_178,local_40.tag_);
      Machine::~Machine(&local_178);
    }
    else {
      local_258.heap._M_t._M_impl._0_4_ = Hcell::hix((Hcell *)&f2.arity);
      pmVar4 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
               operator[](&m->heap,(key_type *)&local_258);
      Hcell::f((Functor *)&h2.f_.arity,pmVar4);
      local_258.heap._M_t._M_impl._0_4_ = Hcell::hix((Hcell *)&h1.f_.arity);
      pmVar4 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
               operator[](&m->heap,(key_type *)&local_258);
      Hcell::f((Functor *)local_108,pmVar4);
      bVar1 = Functor::operator==((Functor *)&h2.f_.arity,(Functor *)local_108);
      if (!bVar1) {
        __assert_fail("f1 == f2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                      ,0x157,"Machine unify(Machine, Addr, Addr)");
      }
      for (iVar5 = 1; iVar5 <= (int)f1.id.field_2._8_4_; iVar5 = iVar5 + 1) {
        Machine::Machine(&local_418,m);
        HVar2 = Hcell::hix((Hcell *)&f2.arity);
        HVar3 = Hcell::hix((Hcell *)&h1.f_.arity);
        a2_00.hix_.hix = HVar3.hix + iVar5;
        a1_00.hix_.hix = HVar2.hix + iVar5;
        a1_00.tag_ = Heap;
        a1_00.r_.r = -0x2a;
        a2_00.tag_ = Heap;
        a2_00.r_.r = -0x2a;
        unify(&local_258,&local_418,a1_00,a2_00);
        Machine::operator=(m,&local_258);
        Machine::~Machine(&local_258);
        Machine::~Machine(&local_418);
      }
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)&h2.f_.arity);
      Machine::Machine(__return_storage_ptr__,m);
    }
    std::__cxx11::string::~string((string *)&h2);
    std::__cxx11::string::~string((string *)&h1);
  }
  return __return_storage_ptr__;
}

Assistant:

Machine unify(Machine m, Addr a1, Addr a2) {
    Addr d1 = deref(m, a1), d2 = deref(m, a2);
    if (d1 == d2) return m;

    Hcell h1 = machineAtAddr(m, d1), h2 = machineAtAddr(m, d2);

    if (h1.tag == Htag::Ref || h2.tag == Htag::Ref) {
        return bind(m, d1, d2);
    } else {
        Functor f1 = m.heap[h1.hix()], f2 = m.heap[h2.hix()];
        assert(f1 == f2);

        for (int i = 1; i <= f1.arity; i++) {
            // We now union the subterms of the functor
            m = unify(m, h1.hix() + i, h2.hix() + i);
        }
    }

    return m;
}